

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O3

dev_t pack_12_20(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  
  if (n == 2) {
    uVar1 = numbers[1];
    uVar4 = (uint)*numbers;
    uVar2 = (ulong)((uint)uVar1 & 0xfffff | uVar4 << 0x14);
    if (uVar1 < 0x100000 && (ulong)(uVar4 & 0xfff) == *numbers) {
      return uVar2;
    }
    pcVar3 = "invalid major number";
    if (0xfffff < uVar1) {
      pcVar3 = "invalid minor number";
    }
  }
  else {
    pcVar3 = "too many fields for format";
    uVar2 = 0;
  }
  *error = pcVar3;
  return uVar2;
}

Assistant:

static dev_t
pack_12_20(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_12_20(numbers[0], numbers[1]);
		if ((u_long)major_12_20(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_12_20(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}